

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Login.cpp
# Opt level: O1

void Handlers::Login_Request(EOClient *client,PacketReader *reader)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  World *this;
  pointer ppCVar5;
  Character *this_00;
  EOClient *pEVar6;
  size_type sVar7;
  size_type sVar8;
  bool bVar9;
  LoginReply num;
  int iVar10;
  int iVar11;
  mapped_type *pmVar12;
  Player *pPVar13;
  long lVar14;
  pointer ppCVar15;
  PacketBuilder reply;
  secure_string password;
  string username;
  undefined1 local_128 [48];
  EOClient *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  key_type local_70;
  key_type local_50;
  
  PacketReader::GetBreakString_abi_cxx11_(&local_b0,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_((string *)local_128,reader,0xff);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_128._0_8_,(pointer)(local_128._8_8_ + local_128._0_8_));
  if ((pointer)local_128._8_8_ != (pointer)0x0) {
    memset((void *)local_128._0_8_,0,local_128._8_8_);
  }
  pcVar1 = local_128 + 0x10;
  local_128._8_8_ = (pointer)0x0;
  *(char *)local_128._0_8_ = '\0';
  local_f8 = client;
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  sVar8 = local_b0._M_string_length;
  p_Var2 = (local_f8->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AccountMaxLength","");
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&p_Var2[0x19]._M_prev,(key_type *)local_128);
  iVar10 = util::variant::GetInt(pmVar12);
  sVar7 = local_f0._M_string_length;
  bVar9 = true;
  pEVar6 = local_f8;
  if (sVar8 <= (ulong)(long)iVar10) {
    p_Var2 = (local_f8->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"PasswordMaxLength","");
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var2[0x19]._M_prev,&local_50);
    iVar10 = util::variant::GetInt(pmVar12);
    pEVar6 = local_f8;
    bVar9 = (ulong)(long)iVar10 < sVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if (!bVar9) {
    util::lowercase((string *)local_128,&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)local_128);
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    p_Var2 = (pEVar6->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    local_128._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"SeoseCompat","");
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var2[0x19]._M_prev,(key_type *)local_128);
    bVar9 = util::variant::GetBool(pmVar12);
    if ((pointer)local_128._0_8_ != pcVar1) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (bVar9) {
      p_Var2 = (pEVar6->super_Client).server[1].clients.
               super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SeoseCompatKey","");
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var2[0x19]._M_prev,&local_70);
      util::variant::GetString_abi_cxx11_(&local_d0,pmVar12);
      seose_str_hash((string *)local_128,&local_f0,&local_d0);
      util::secure_string::operator=((secure_string *)&local_f0,(string *)local_128);
      if ((pointer)local_128._0_8_ != pcVar1) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    iVar10 = World::CheckBan((World *)(pEVar6->super_Client).server[1].clients.
                                      super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                                      _M_node.super__List_node_base._M_next,&local_b0,
                             (IPAddress *)0x0,(int *)0x0);
    sVar7 = local_b0._M_string_length;
    if (iVar10 == -1) {
      p_Var2 = (pEVar6->super_Client).server[1].clients.
               super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
      local_128._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AccountMinLength","");
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var2[0x19]._M_prev,(key_type *)local_128);
      iVar10 = util::variant::GetInt(pmVar12);
      if ((pointer)local_128._0_8_ != pcVar1) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      sVar8 = local_f0._M_string_length;
      if (sVar7 < (ulong)(long)iVar10) {
        PacketBuilder::PacketBuilder((PacketBuilder *)local_128,PACKET_LOGIN,PACKET_REPLY,2);
        PacketBuilder::AddShort((PacketBuilder *)local_128,1);
        EOClient::Send(local_f8,(PacketBuilder *)local_128);
      }
      else {
        p_Var2 = (local_f8->super_Client).server[1].clients.
                 super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        local_128._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"PasswordMinLength","");
        pmVar12 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var2[0x19]._M_prev,(key_type *)local_128);
        iVar10 = util::variant::GetInt(pmVar12);
        if ((pointer)local_128._0_8_ != pcVar1) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
        if (sVar8 < (ulong)(long)iVar10) {
          PacketBuilder::PacketBuilder((PacketBuilder *)local_128,PACKET_LOGIN,PACKET_REPLY,2);
          pEVar6 = local_f8;
          PacketBuilder::AddShort((PacketBuilder *)local_128,2);
          EOClient::Send(pEVar6,(PacketBuilder *)local_128);
        }
        else {
          p_Var2 = (local_f8->super_Client).server[1].clients.
                   super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                   super__List_node_base._M_next;
          p_Var3 = p_Var2[0x46]._M_prev;
          p_Var4 = p_Var2[0x46]._M_next;
          local_128._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"MaxPlayers","");
          pmVar12 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&p_Var2[0x19]._M_prev,(key_type *)local_128);
          iVar10 = util::variant::GetInt(pmVar12);
          if ((pointer)local_128._0_8_ != pcVar1) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          pEVar6 = local_f8;
          if ((ulong)((long)p_Var3 - (long)p_Var4 >> 3) < (ulong)(long)iVar10) {
            num = World::LoginCheck((World *)(local_f8->super_Client).server[1].clients.
                                             super__List_base<Client_*,_std::allocator<Client_*>_>.
                                             _M_impl._M_node.super__List_node_base._M_next,&local_b0
                                    ,(secure_string *)&local_f0);
            if (num == LOGIN_OK) {
              this = (World *)(pEVar6->super_Client).server[1].clients.
                              super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                              super__List_node_base._M_next;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,local_b0._M_dataplus._M_p,
                         local_b0._M_dataplus._M_p + local_b0._M_string_length);
              pPVar13 = World::Login(this,&local_90);
              pEVar6->player = pPVar13;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if (pEVar6->player == (Player *)0x0) {
                PacketBuilder::PacketBuilder((PacketBuilder *)local_128,PACKET_LOGIN,PACKET_REPLY,2)
                ;
                PacketBuilder::AddShort((PacketBuilder *)local_128,1);
                EOClient::Send(pEVar6,(PacketBuilder *)local_128);
              }
              else {
                pEVar6->player->id = pEVar6->id;
                pEVar6->player->client = pEVar6;
                pEVar6->state = LoggedIn;
                lVar14 = (long)(pEVar6->player->characters).
                               super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)(pEVar6->player->characters).
                               super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
                               .super__Vector_impl_data._M_start;
                PacketBuilder::PacketBuilder
                          ((PacketBuilder *)local_128,PACKET_LOGIN,PACKET_REPLY,
                           (lVar14 >> 2) + lVar14 * 4 + 5);
                PacketBuilder::AddShort((PacketBuilder *)local_128,3);
                PacketBuilder::AddChar
                          ((PacketBuilder *)local_128,
                           (uchar)((uint)(*(int *)&(pEVar6->player->characters).
                                                                                                      
                                                  super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                         *(int *)&(pEVar6->player->characters).
                                                  super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                PacketBuilder::AddByte((PacketBuilder *)local_128,'\x02');
                PacketBuilder::AddByte((PacketBuilder *)local_128,0xff);
                ppCVar15 = (pEVar6->player->characters).
                           super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                           super__Vector_impl_data._M_start;
                ppCVar5 = (pEVar6->player->characters).
                          super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (ppCVar15 != ppCVar5) {
                  do {
                    this_00 = *ppCVar15;
                    (*(this_00->super_Command_Source)._vptr_Command_Source[2])(&local_d0,this_00);
                    PacketBuilder::AddBreakString((PacketBuilder *)local_128,&local_d0,0xff);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p,
                                      local_d0.field_2._M_allocated_capacity + 1);
                    }
                    PacketBuilder::AddInt((PacketBuilder *)local_128,this_00->id);
                    PacketBuilder::AddChar((PacketBuilder *)local_128,this_00->level);
                    PacketBuilder::AddChar((PacketBuilder *)local_128,this_00->gender);
                    PacketBuilder::AddChar((PacketBuilder *)local_128,this_00->hairstyle);
                    PacketBuilder::AddChar((PacketBuilder *)local_128,this_00->haircolor);
                    PacketBuilder::AddChar((PacketBuilder *)local_128,this_00->race);
                    PacketBuilder::AddChar((PacketBuilder *)local_128,this_00->admin);
                    Character::AddPaperdollData(this_00,(PacketBuilder *)local_128,"BAHSW");
                    PacketBuilder::AddByte((PacketBuilder *)local_128,0xff);
                    ppCVar15 = ppCVar15 + 1;
                  } while (ppCVar15 != ppCVar5);
                }
                EOClient::Send(local_f8,(PacketBuilder *)local_128);
              }
            }
            else {
              PacketBuilder::PacketBuilder((PacketBuilder *)local_128,PACKET_LOGIN,PACKET_REPLY,2);
              PacketBuilder::AddShort((PacketBuilder *)local_128,num);
              EOClient::Send(pEVar6,(PacketBuilder *)local_128);
              p_Var2 = (pEVar6->super_Client).server[1].clients.
                       super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                       super__List_node_base._M_next;
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"MaxLoginAttempts","");
              pmVar12 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&p_Var2[0x19]._M_prev,&local_d0);
              iVar10 = util::variant::GetInt(pmVar12);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((iVar10 != 0) &&
                 (iVar11 = pEVar6->login_attempts + 1, pEVar6->login_attempts = iVar11,
                 iVar10 <= iVar11)) {
                Client::Close(&pEVar6->super_Client,false);
              }
            }
          }
          else {
            PacketBuilder::PacketBuilder((PacketBuilder *)local_128,PACKET_LOGIN,PACKET_REPLY,2);
            pEVar6 = local_f8;
            PacketBuilder::AddShort((PacketBuilder *)local_128,6);
            EOClient::Send(pEVar6,(PacketBuilder *)local_128);
            Client::Close(&pEVar6->super_Client,false);
          }
        }
      }
    }
    else {
      PacketBuilder::PacketBuilder((PacketBuilder *)local_128,PACKET_F_INIT,PACKET_A_INIT,2);
      PacketBuilder::AddByte((PacketBuilder *)local_128,'\x03');
      PacketBuilder::AddByte((PacketBuilder *)local_128,'\x02');
      EOClient::Send(pEVar6,(PacketBuilder *)local_128);
      Client::Close(&pEVar6->super_Client,false);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_128);
  }
  if (local_f0._M_string_length != 0) {
    memset(local_f0._M_dataplus._M_p,0,local_f0._M_string_length);
  }
  local_f0._M_string_length = 0;
  *local_f0._M_dataplus._M_p = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Login_Request(EOClient *client, PacketReader &reader)
{
	std::string username = reader.GetBreakString();
	util::secure_string password(std::move(reader.GetBreakString()));

	if (username.length() > std::size_t(int(client->server()->world->config["AccountMaxLength"]))
	 || password.str().length() > std::size_t(int(client->server()->world->config["PasswordMaxLength"])))
	{
		return;
	}

	username = util::lowercase(username);

	if (client->server()->world->config["SeoseCompat"])
		password = std::move(seose_str_hash(password.str(), client->server()->world->config["SeoseCompatKey"]));

	if (client->server()->world->CheckBan(&username, 0, 0) != -1)
	{
		PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 2);
		reply.AddByte(INIT_BANNED);
		reply.AddByte(INIT_BAN_PERM);
		client->Send(reply);
		client->Close();
		return;
	}

	if (username.length() < std::size_t(int(client->server()->world->config["AccountMinLength"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USER);
		client->Send(reply);
		return;
	}

	if (password.str().length() < std::size_t(int(client->server()->world->config["PasswordMinLength"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USERPASS);
		client->Send(reply);
		return;
	}

	if (client->server()->world->characters.size() >= static_cast<std::size_t>(static_cast<int>(client->server()->world->config["MaxPlayers"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_BUSY);
		client->Send(reply);
		client->Close();
		return;
	}

	LoginReply login_reply = client->server()->world->LoginCheck(username, std::move(password));

	if (login_reply != LOGIN_OK)
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(login_reply);
		client->Send(reply);

		int max_login_attempts = int(client->server()->world->config["MaxLoginAttempts"]);

		if (max_login_attempts != 0 && ++client->login_attempts >= max_login_attempts)
		{
			client->Close();
		}

		return;
	}

	client->player = client->server()->world->Login(username);

	if (!client->player)
	{
		// Someone deleted the account between checking it and logging in
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USER);
		client->Send(reply);
		return;
	}

	client->player->id = client->id;
	client->player->client = client;
	client->state = EOClient::LoggedIn;

	PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 5 + client->player->characters.size() * 34);
	reply.AddShort(LOGIN_OK);
	reply.AddChar(client->player->characters.size());
	reply.AddByte(2);
	reply.AddByte(255);
	UTIL_FOREACH(client->player->characters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddInt(character->id);
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddChar(character->admin);
		character->AddPaperdollData(reply, "BAHSW");

		reply.AddByte(255);
	}
	client->Send(reply);
}